

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  FILE *__stream;
  size_t sVar7;
  long lVar8;
  long lVar9;
  wasm_memory_t *pwVar10;
  wasm_func_t *func;
  wasm_func_t *func_00;
  wasm_func_t *func_01;
  undefined8 uVar11;
  char *pcVar12;
  undefined8 uVar13;
  wasm_byte_vec_t binary;
  wasm_limits_t limits;
  wasm_extern_vec_t exports;
  wasm_extern_vec_t imports;
  
  puts("Initializing...");
  uVar5 = wasm_engine_new();
  uVar6 = wasm_store_new(uVar5);
  puts("Loading binary...");
  __stream = fopen("memory.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar7 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar7);
    sVar7 = fread(binary.data,sVar7,1,__stream);
    if (sVar7 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar8 = wasm_module_new(uVar6,&binary);
      if (lVar8 == 0) {
        pcVar12 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Instantiating module...");
        imports.size = 0;
        imports.data = (wasm_extern_t **)0x0;
        lVar9 = wasm_instance_new(uVar6,lVar8,&imports,0);
        if (lVar9 != 0) {
          puts("Extracting exports...");
          wasm_instance_exports(lVar9);
          pwVar10 = get_export_memory(&exports,0);
          func = get_export_func(&exports,1);
          func_00 = get_export_func(&exports,2);
          func_01 = get_export_func(&exports,3);
          wasm_module_delete(lVar8);
          uVar11 = wasm_memory_copy(pwVar10);
          cVar1 = wasm_memory_same(pwVar10,uVar11);
          if (cVar1 != '\0') {
            wasm_memory_delete(uVar11);
            puts("Checking memory...");
            iVar4 = wasm_memory_size(pwVar10);
            check(iVar4 == 2);
            lVar8 = wasm_memory_data_size(pwVar10);
            check(lVar8 == 0x20000);
            pcVar12 = (char *)wasm_memory_data(pwVar10);
            check(*pcVar12 == '\0');
            lVar8 = wasm_memory_data(pwVar10);
            check(*(char *)(lVar8 + 0x1000) == '\x01');
            lVar8 = wasm_memory_data(pwVar10);
            check(*(char *)(lVar8 + 0x1003) == '\x04');
            check_call0(func,2);
            check_call1(func_00,0,0);
            check_call1(func_00,0x1000,1);
            check_call1(func_00,0x1003,4);
            check_call1(func_00,0x1ffff,0);
            check_trap1(func_00,0x20000);
            puts("Mutating memory...");
            lVar8 = wasm_memory_data(pwVar10);
            *(undefined1 *)(lVar8 + 0x1003) = 5;
            check_ok2(func_01,0x1002,6);
            check_trap2(func_01,0x20000,0);
            lVar8 = wasm_memory_data(pwVar10);
            check(*(char *)(lVar8 + 0x1002) == '\x06');
            lVar8 = wasm_memory_data(pwVar10);
            check(*(char *)(lVar8 + 0x1003) == '\x05');
            check_call1(func_00,0x1002,6);
            check_call1(func_00,0x1003,5);
            puts("Growing memory...");
            _Var2 = (_Bool)wasm_memory_grow(pwVar10,1);
            check(_Var2);
            iVar4 = wasm_memory_size(pwVar10);
            check(iVar4 == 3);
            lVar8 = wasm_memory_data_size(pwVar10);
            check(lVar8 == 0x30000);
            check_call1(func_00,0x20000,0);
            check_ok2(func_01,0x20000,0);
            check_trap1(func_00,0x30000);
            check_trap2(func_01,0x30000,0);
            bVar3 = wasm_memory_grow(pwVar10,1);
            check((_Bool)(bVar3 ^ 1));
            _Var2 = (_Bool)wasm_memory_grow(pwVar10,0);
            check(_Var2);
            wasm_extern_vec_delete(&exports);
            wasm_instance_delete(lVar9);
            puts("Creating stand-alone memory...");
            uVar11 = wasm_memorytype_new();
            uVar13 = wasm_memory_new(uVar6,uVar11);
            iVar4 = wasm_memory_size(uVar13);
            check(iVar4 == 5);
            bVar3 = wasm_memory_grow(uVar13,1);
            check((_Bool)(bVar3 ^ 1));
            _Var2 = (_Bool)wasm_memory_grow(uVar13,0);
            check(_Var2);
            wasm_memorytype_delete(uVar11);
            wasm_memory_delete(uVar13);
            puts("Shutting down...");
            wasm_store_delete(uVar6);
            wasm_engine_delete(uVar5);
            puts("Done.");
            return 0;
          }
          __assert_fail("wasm_memory_same(memory, copy)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/memory.c"
                        ,0x9a,"int main(int, const char **)");
        }
        pcVar12 = "> Error instantiating module!";
      }
      goto LAB_00101a42;
    }
  }
  pcVar12 = "> Error loading module!";
LAB_00101a42:
  puts(pcVar12);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("memory.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_memory_t* memory = get_export_memory(&exports, i++);
  wasm_func_t* size_func = get_export_func(&exports, i++);
  wasm_func_t* load_func = get_export_func(&exports, i++);
  wasm_func_t* store_func = get_export_func(&exports, i++);

  wasm_module_delete(module);

  // Try cloning.
  own wasm_memory_t* copy = wasm_memory_copy(memory);
  assert(wasm_memory_same(memory, copy));
  wasm_memory_delete(copy);

  // Check initial memory.
  printf("Checking memory...\n");
  check(wasm_memory_size(memory) == 2);
  check(wasm_memory_data_size(memory) == 0x20000);
  check(wasm_memory_data(memory)[0] == 0);
  check(wasm_memory_data(memory)[0x1000] == 1);
  check(wasm_memory_data(memory)[0x1003] == 4);

  check_call0(size_func, 2);
  check_call1(load_func, 0, 0);
  check_call1(load_func, 0x1000, 1);
  check_call1(load_func, 0x1003, 4);
  check_call1(load_func, 0x1ffff, 0);
  check_trap1(load_func, 0x20000);

  // Mutate memory.
  printf("Mutating memory...\n");
  wasm_memory_data(memory)[0x1003] = 5;
  check_ok2(store_func, 0x1002, 6);
  check_trap2(store_func, 0x20000, 0);

  check(wasm_memory_data(memory)[0x1002] == 6);
  check(wasm_memory_data(memory)[0x1003] == 5);
  check_call1(load_func, 0x1002, 6);
  check_call1(load_func, 0x1003, 5);

  // Grow memory.
  printf("Growing memory...\n");
  check(wasm_memory_grow(memory, 1));
  check(wasm_memory_size(memory) == 3);
  check(wasm_memory_data_size(memory) == 0x30000);

  check_call1(load_func, 0x20000, 0);
  check_ok2(store_func, 0x20000, 0);
  check_trap1(load_func, 0x30000);
  check_trap2(store_func, 0x30000, 0);

  check(! wasm_memory_grow(memory, 1));
  check(wasm_memory_grow(memory, 0));

  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Create stand-alone memory.
  // TODO(wasm+): Once Wasm allows multiple memories, turn this into import.
  printf("Creating stand-alone memory...\n");
  wasm_limits_t limits = {5, 5};
  own wasm_memorytype_t* memorytype = wasm_memorytype_new(&limits);
  own wasm_memory_t* memory2 = wasm_memory_new(store, memorytype);
  check(wasm_memory_size(memory2) == 5);
  check(! wasm_memory_grow(memory2, 1));
  check(wasm_memory_grow(memory2, 0));

  wasm_memorytype_delete(memorytype);
  wasm_memory_delete(memory2);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}